

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count128_lcg_shift.hpp
# Opt level: O0

result_type __thiscall trng::count128_lcg_shift::operator()(count128_lcg_shift *this)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  long in_RDI;
  result_type t;
  result_type t_lo;
  result_type t_hi;
  count128_lcg_shift *in_stack_ffffffffffffffe0;
  
  step(in_stack_ffffffffffffffe0);
  uVar1 = optimized_impl::uint128::hi((uint128 *)(in_RDI + 0x20));
  uVar2 = optimized_impl::uint128::lo((uint128 *)(in_RDI + 0x20));
  uVar3 = (uVar2 ^ uVar1) * *(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x18);
  uVar3 = uVar3 >> 0x17 ^ uVar3;
  uVar3 = uVar3 << 0x29 ^ uVar3;
  return uVar3 >> 0x12 ^ uVar3;
}

Assistant:

TRNG_CUDA_ENABLE
  inline count128_lcg_shift::result_type count128_lcg_shift::operator()() {
    step();
    const result_type t_hi{S.r.hi()};
    const result_type t_lo{S.r.lo()};
    result_type t{(t_lo ^ t_hi) * P.a + P.b};
    t ^= (t >> 23u);
    t ^= (t << 41u);
    t ^= (t >> 18u);
    return t;
  }